

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v11::detail::is_printable
               (uint16_t x,singleton *singletons,size_t singletons_size,uchar *singleton_lowers,
               uchar *normal,size_t normal_size)

{
  bool bVar1;
  uint local_74;
  int len;
  int v;
  size_t i_1;
  uint local_58;
  int iStack_54;
  bool current;
  int xsigned;
  int j;
  int lower_end;
  singleton s;
  size_t i;
  int lower_start;
  int upper;
  size_t normal_size_local;
  uchar *normal_local;
  uchar *singleton_lowers_local;
  size_t singletons_size_local;
  singleton *singletons_local;
  uint16_t x_local;
  
  i._0_4_ = 0;
  for (_lower_end = 0; _lower_end < singletons_size; _lower_end = _lower_end + 1) {
    j._3_1_ = singletons[_lower_end].lower_count;
    j._2_1_ = singletons[_lower_end].upper;
    if ((uint)((int)(uint)x >> 8) < (uint)j._2_1_) break;
    if ((int)(uint)x >> 8 == (uint)j._2_1_) {
      for (iStack_54 = (int)i; iStack_54 < (int)((int)i + (uint)j._3_1_); iStack_54 = iStack_54 + 1)
      {
        if ((ushort)singleton_lowers[iStack_54] == (x & 0xff)) {
          return false;
        }
      }
    }
    i._0_4_ = (int)i + (uint)j._3_1_;
  }
  local_58 = (uint)x;
  bVar1 = true;
  _len = 0;
  while( true ) {
    if (normal_size <= _len) {
      return bVar1;
    }
    local_74 = (uint)normal[_len];
    if ((normal[_len] & 0x80) != 0) {
      local_74 = (local_74 & 0x7f) << 8 | (uint)normal[_len + 1];
      _len = _len + 1;
    }
    local_58 = local_58 - local_74;
    if ((int)local_58 < 0) break;
    bVar1 = (bool)(bVar1 ^ 1);
    _len = _len + 1;
  }
  return bVar1;
}

Assistant:

inline auto is_printable(uint16_t x, const singleton* singletons,
                         size_t singletons_size,
                         const unsigned char* singleton_lowers,
                         const unsigned char* normal, size_t normal_size)
    -> bool {
  auto upper = x >> 8;
  auto lower_start = 0;
  for (size_t i = 0; i < singletons_size; ++i) {
    auto s = singletons[i];
    auto lower_end = lower_start + s.lower_count;
    if (upper < s.upper) break;
    if (upper == s.upper) {
      for (auto j = lower_start; j < lower_end; ++j) {
        if (singleton_lowers[j] == (x & 0xff)) return false;
      }
    }
    lower_start = lower_end;
  }

  auto xsigned = static_cast<int>(x);
  auto current = true;
  for (size_t i = 0; i < normal_size; ++i) {
    auto v = static_cast<int>(normal[i]);
    auto len = (v & 0x80) != 0 ? (v & 0x7f) << 8 | normal[++i] : v;
    xsigned -= len;
    if (xsigned < 0) break;
    current = !current;
  }
  return current;
}